

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall
FxMemberFunctionCall::Resolve(FxMemberFunctionCall *this,FCompileContext *ctx)

{
  uint uVar1;
  Variant *pVVar2;
  PType *pPVar3;
  PClass *pPVar4;
  PClass *pPVar5;
  PInt *pPVar6;
  PStruct *pPVar7;
  int iVar8;
  ulong uVar9;
  PStruct *pPVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PFunction *callee;
  PClass *pPVar11;
  PClass *pPVar12;
  PPointer *pPVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  FxVMFunctionCall *this_00;
  undefined4 extraout_var_05;
  long *plVar14;
  FxExpression *pFVar15;
  FxGetClass *this_01;
  undefined8 *puVar16;
  undefined8 uVar17;
  undefined **ppuVar18;
  FxAssign *this_02;
  FxExpression *right;
  undefined4 extraout_var_06;
  char *pcVar19;
  long lVar20;
  char *message;
  char *pcVar21;
  undefined4 uVar22;
  undefined8 unaff_RBP;
  FScriptPosition *pFVar23;
  byte bVar24;
  bool bVar25;
  bool writable;
  bool error;
  char local_51;
  undefined8 local_50;
  bool local_45;
  undefined4 local_44;
  FArgumentList *local_40;
  FName local_38;
  FName local_34;
  
  if (ctx->Class == (PStruct *)0x0) goto LAB_0053314b;
  uVar9 = (ulong)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count;
  if (uVar9 != 0) {
    lVar20 = 0;
    do {
      if (*(long *)((long)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array +
                   lVar20) == 0) {
        pFVar15 = (FxExpression *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Empty function argument.");
        goto LAB_005335f0;
      }
      lVar20 = lVar20 + 8;
    } while (uVar9 << 3 != lVar20);
  }
  pFVar15 = this->Self;
  if (pFVar15->ExprType == EFX_Identifier) {
    local_34.Index = *(int *)&pFVar15[1]._vptr_FxExpression;
    pPVar10 = FindStructType(&local_34);
    pFVar15 = this->Self;
    if (pPVar10 == (PStruct *)0x0) {
      if (pFVar15 == (FxExpression *)0x0) goto LAB_0053314b;
      goto LAB_0053307e;
    }
    *(undefined1 *)((long)&pFVar15[1]._vptr_FxExpression + 4) = 1;
  }
  else {
LAB_0053307e:
    pPVar10 = (PStruct *)0x0;
  }
  iVar8 = (*pFVar15->_vptr_FxExpression[2])();
  pFVar15 = (FxExpression *)CONCAT44(extraout_var,iVar8);
  this->Self = pFVar15;
  pPVar11 = PClass::RegistrationInfo.MyClass;
  if (pFVar15 == (FxExpression *)0x0) goto LAB_0053314b;
  if ((pPVar10 != (PStruct *)0x0) && (pFVar15->ValueType == &TypeError->super_PType)) {
    pPVar12 = (pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
              super_DObject.Class;
    if (pPVar12 == (PClass *)0x0) {
      iVar8 = (**(pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                 super_DObject._vptr_DObject)(pPVar10);
      pPVar12 = (PClass *)CONCAT44(extraout_var_00,iVar8);
      (pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
      Class = pPVar12;
    }
    bVar25 = pPVar12 != (PClass *)0x0;
    if (pPVar12 != pPVar11 && bVar25) {
      do {
        pPVar12 = pPVar12->ParentClass;
        bVar25 = pPVar12 != (PClass *)0x0;
        if (pPVar12 == pPVar11) break;
      } while (pPVar12 != (PClass *)0x0);
    }
    if ((bVar25) &&
       (*(char *)((long)&pPVar10[1].super_PNamedType.super_PCompoundType.super_PType.HashNext + 1)
        == '\0')) {
      pFVar15 = this->Self;
      goto LAB_005331fc;
    }
    uVar22 = 0;
    bVar24 = 1;
    goto LAB_00533116;
  }
LAB_005331fc:
  if (pFVar15->ExprType == EFX_Super) {
    pPVar11 = dyn_cast<PClass>((DObject *)((ctx->Function->Variants).Array)->SelfClass);
    if (pPVar11 == (PClass *)0x0) {
      uVar22 = 0;
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Super requires a class type");
      pFVar15 = this->Self;
    }
    else {
      pPVar13 = NewPointer((PType *)pPVar11->ParentClass,false);
      pFVar15 = this->Self;
      pFVar15->ValueType = (PType *)pPVar13;
      pFVar15->ExprType = EFX_Self;
      uVar22 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    }
  }
  else {
    uVar22 = 0;
  }
  pPVar7 = TypeStringStruct;
  pPVar10 = (PStruct *)pFVar15->ValueType;
  if ((pPVar10 != (PStruct *)TypeTextureID) || (uVar1 = (this->MethodName).Index, 4 < uVar1 - 0x27f)
     ) {
    if (((pPVar10 == TypeVector2) || (pPVar10 == TypeVector3)) &&
       (uVar1 = (this->MethodName).Index, uVar1 - 0x279 < 2)) {
      if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
        plVar14 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar15 = this->Self;
        iVar8 = (this->MethodName).Index;
        *plVar14 = (long)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition((FScriptPosition *)(plVar14 + 1),&pFVar15->ScriptPosition);
        plVar14[3] = 0;
        *(undefined2 *)(plVar14 + 4) = 0x100;
        *(undefined4 *)((long)plVar14 + 0x24) = 0x3f;
        *plVar14 = (long)&PTR__FxVectorBuiltin_0070cc08;
        plVar14[6] = (long)pFVar15;
        *(int *)(plVar14 + 5) = iVar8;
        this->Self = (FxExpression *)0x0;
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        pFVar15 = (FxExpression *)(**(code **)(*plVar14 + 0x10))(plVar14,ctx);
        return pFVar15;
      }
      goto LAB_00533394;
    }
    if (pPVar10 == (PStruct *)TypeString) {
      pFVar15->ValueType = (PType *)TypeStringStruct;
      pPVar10 = pPVar7;
    }
    pPVar12 = PPointer::RegistrationInfo.MyClass;
    pPVar11 = (pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
              super_DObject.Class;
    if (pPVar11 == (PClass *)0x0) {
      iVar8 = (**(pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                 super_DObject._vptr_DObject)(pPVar10);
      pPVar11 = (PClass *)CONCAT44(extraout_var_01,iVar8);
      (pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
      Class = pPVar11;
    }
    pPVar4 = PStruct::RegistrationInfo.MyClass;
    bVar25 = pPVar11 != (PClass *)0x0;
    if (pPVar11 != pPVar12 && bVar25) {
      do {
        pPVar11 = pPVar11->ParentClass;
        bVar25 = pPVar11 != (PClass *)0x0;
        if (pPVar11 == pPVar12) break;
      } while (pPVar11 != (PClass *)0x0);
    }
    pPVar3 = this->Self->ValueType;
    if (bVar25) {
      pPVar10 = (PStruct *)pPVar3[1].super_PTypeBase.super_DObject._vptr_DObject;
      pPVar11 = (pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                super_DObject.Class;
      if (pPVar11 == (PClass *)0x0) {
        iVar8 = (**(pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                   super_DObject._vptr_DObject)(pPVar10);
        pPVar11 = (PClass *)CONCAT44(extraout_var_02,iVar8);
        (pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
        Class = pPVar11;
      }
      pPVar5 = PClass::RegistrationInfo.MyClass;
      bVar25 = pPVar11 != (PClass *)0x0;
      pPVar12 = pPVar11;
      if (pPVar11 != pPVar4 && bVar25) {
        do {
          pPVar12 = pPVar12->ParentClass;
          bVar25 = pPVar12 != (PClass *)0x0;
          if (pPVar12 == pPVar4) break;
        } while (pPVar12 != (PClass *)0x0);
      }
      if (!bVar25) {
        pcVar19 = FName::NameData.NameArray[(this->MethodName).Index].Text;
        pcVar21 = "Left hand side of %s must point to a class object\n";
        goto LAB_005335e1;
      }
      if (pPVar11 == (PClass *)0x0) {
        iVar8 = (**(pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                   super_DObject._vptr_DObject)(pPVar10);
        pPVar11 = (PClass *)CONCAT44(extraout_var_03,iVar8);
        (pPVar10->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
        Class = pPVar11;
      }
      bVar25 = pPVar11 != (PClass *)0x0;
      if (pPVar11 != pPVar5 && bVar25) {
        do {
          pPVar11 = pPVar11->ParentClass;
          bVar25 = pPVar11 != (PClass *)0x0;
          if (pPVar11 == pPVar5) break;
        } while (pPVar11 != (PClass *)0x0);
      }
      bVar24 = 0;
      if ((!bVar25) || (bVar24 = 0, (this->MethodName).Index != 0xd6)) goto LAB_00533116;
      if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
        this_01 = (FxGetClass *)FMemArena::Alloc(&FxAlloc,0x30);
        pFVar15 = this->Self;
        (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370
        ;
        FScriptPosition::FScriptPosition
                  (&(this_01->super_FxExpression).ScriptPosition,&pFVar15->ScriptPosition);
        (this_01->super_FxExpression).ValueType = (PType *)0x0;
        (this_01->super_FxExpression).isresolved = false;
        (this_01->super_FxExpression).NeedResult = true;
        (this_01->super_FxExpression).ExprType = EFX_GetClass;
        (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxGetClass_0070cc70;
        this_01->Self = pFVar15;
        pFVar15 = FxGetClass::Resolve(this_01,ctx);
        return pFVar15;
      }
      pcVar19 = FName::NameData.NameArray[0xd6].Text;
      goto LAB_005333ab;
    }
    pPVar11 = (pPVar3->super_PTypeBase).super_DObject.Class;
    if (pPVar11 == (PClass *)0x0) {
      iVar8 = (**(pPVar3->super_PTypeBase).super_DObject._vptr_DObject)(pPVar3);
      pPVar11 = (PClass *)CONCAT44(extraout_var_04,iVar8);
      (pPVar3->super_PTypeBase).super_DObject.Class = pPVar11;
    }
    bVar25 = pPVar11 != (PClass *)0x0;
    if (pPVar11 != pPVar4 && bVar25) {
      do {
        pPVar11 = pPVar11->ParentClass;
        bVar25 = pPVar11 != (PClass *)0x0;
        if (pPVar11 == pPVar4) break;
      } while (pPVar11 != (PClass *)0x0);
    }
    if (((!bVar25) ||
        (iVar8 = (*this->Self->_vptr_FxExpression[4])(this->Self,ctx,&local_51), (char)iVar8 == '\0'
        )) || (local_51 != '\x01')) {
      pcVar19 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      pcVar21 = "Invalid expression on left hand side of %s\n";
      goto LAB_005335e1;
    }
    pPVar10 = (PStruct *)this->Self->ValueType;
    bVar24 = 0;
    pPVar13 = NewPointer((PType *)pPVar10,false);
    this->Self->ValueType = (PType *)pPVar13;
LAB_00533116:
    local_45 = false;
    local_38.Index = (this->MethodName).Index;
    local_50 = &(this->super_FxExpression).ScriptPosition;
    local_44 = uVar22;
    callee = FindClassMemberFunction(pPVar10,ctx->Class,&local_38,local_50,&local_45);
    if (local_45 == true) goto LAB_0053314b;
    pFVar23 = local_50;
    if (callee == (PFunction *)0x0) {
      pcVar19 = FName::NameData.NameArray[(this->MethodName).Index].Text;
      pcVar21 = "Unknown function %s\n";
      goto LAB_005335e4;
    }
    pVVar2 = (callee->Variants).Array;
    uVar1 = pVVar2->Flags;
    if (bVar24 == 0) {
      if ((uVar1 & 2) != 0) {
        pFVar15 = this->Self;
        if (pFVar15->ExprType != EFX_Self) {
          if ((pVVar2->UseFlags & 1) != 0) goto LAB_0053363f;
          pcVar19 = FName::NameData.NameArray
                    [*(int *)&(callee->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text
          ;
          pcVar21 = "Function %s cannot be used with a non-self object\n";
          goto LAB_005335e4;
        }
        bVar25 = CheckFunctionCompatiblity(local_50,ctx->Function,callee);
        if (!bVar25) goto LAB_0053314b;
        if ((((callee->Variants).Array)->Flags & 2) != 0) {
          pFVar15 = this->Self;
          goto LAB_0053363f;
        }
      }
    }
    else if ((uVar1 & 2) != 0) {
      pPVar11 = dyn_cast<PClass>((DObject *)ctx->Class);
      pPVar12 = dyn_cast<PClass>((DObject *)pPVar10);
      if ((pPVar11 == (PClass *)0x0) || (pPVar12 == (PClass *)0x0)) {
LAB_0053376e:
        pcVar19 = FName::NameData.NameArray[(pPVar10->super_PNamedType).TypeName.Index].Text;
        pcVar21 = FName::NameData.NameArray[(this->MethodName).Index].Text;
        message = "Cannot call non-static function %s::%s from here\n";
      }
      else {
        if (pPVar11 != pPVar12) {
          do {
            pPVar11 = pPVar11->ParentClass;
            if (pPVar11 == pPVar12) break;
          } while (pPVar11 != (PClass *)0x0);
          if (pPVar11 == (PClass *)0x0) goto LAB_0053376e;
        }
        pcVar19 = FName::NameData.NameArray[(pPVar10->super_PNamedType).TypeName.Index].Text;
        pcVar21 = FName::NameData.NameArray[(this->MethodName).Index].Text;
        message = "Qualified member call to parent class %s::%s is not yet implemented\n";
      }
      pFVar15 = (FxExpression *)0x0;
      FScriptPosition::Message(local_50,2,message,pcVar19,pcVar21);
      goto LAB_005335f0;
    }
    pFVar15 = (FxExpression *)0x0;
LAB_0053363f:
    local_40 = &this->ArgList;
    this_00 = (FxVMFunctionCall *)FMemArena::Alloc(&FxAlloc,0x68);
    FxVMFunctionCall::FxVMFunctionCall
              (this_00,pFVar15,callee,local_40,local_50,(bool)((byte)local_44 | bVar24));
    if (this->Self == pFVar15) {
      this->Self = (FxExpression *)0x0;
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    iVar8 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
    return (FxExpression *)CONCAT44(extraout_var_05,iVar8);
  }
  if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count != 0) {
LAB_00533394:
    pcVar19 = FName::NameData.NameArray[uVar1].Text;
LAB_005333ab:
    pcVar21 = "too many parameters in call to %s";
LAB_005335e1:
    pFVar23 = &(this->super_FxExpression).ScriptPosition;
LAB_005335e4:
    pFVar15 = (FxExpression *)0x0;
    FScriptPosition::Message(pFVar23,2,pcVar21,pcVar19);
    goto LAB_005335f0;
  }
  pFVar15->ValueType = (PType *)TypeSInt32;
  pFVar23 = &(this->super_FxExpression).ScriptPosition;
  switch(uVar1) {
  case 0x27f:
    this_02 = (FxAssign *)FMemArena::Alloc(&FxAlloc,0x48);
    pFVar15 = this->Self;
    puVar16 = (undefined8 *)FMemArena::Alloc(&FxAlloc,0x38);
    *puVar16 = &PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition((FScriptPosition *)(puVar16 + 1),pFVar23);
    *(undefined1 *)((long)puVar16 + 0x21) = 1;
    *(undefined4 *)((long)puVar16 + 0x24) = 4;
    *puVar16 = &PTR__FxConstant_0070d3e8;
    pPVar6 = TypeSInt32;
    puVar16[5] = TypeSInt32;
    puVar16[3] = pPVar6;
    *(undefined4 *)(puVar16 + 6) = 0;
    *(undefined1 *)(puVar16 + 4) = 1;
    (this_02->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(this_02->super_FxExpression).ScriptPosition,&pFVar15->ScriptPosition);
    (this_02->super_FxExpression).ValueType = (PType *)0x0;
    (this_02->super_FxExpression).isresolved = false;
    (this_02->super_FxExpression).NeedResult = true;
    uVar17 = 0x3e00000016;
    break;
  case 0x280:
    this_02 = (FxAssign *)FMemArena::Alloc(&FxAlloc,0x40);
    pFVar15 = this->Self;
    puVar16 = (undefined8 *)FMemArena::Alloc(&FxAlloc,0x38);
    *puVar16 = &PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition((FScriptPosition *)(puVar16 + 1),pFVar23);
    *(undefined1 *)((long)puVar16 + 0x21) = 1;
    *(undefined4 *)((long)puVar16 + 0x24) = 4;
    *puVar16 = &PTR__FxConstant_0070d3e8;
    pPVar6 = TypeSInt32;
    puVar16[5] = TypeSInt32;
    puVar16[3] = pPVar6;
    *(undefined4 *)(puVar16 + 6) = 0;
    *(undefined1 *)(puVar16 + 4) = 1;
    (this_02->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(this_02->super_FxExpression).ScriptPosition,&pFVar15->ScriptPosition);
    (this_02->super_FxExpression).ValueType = (PType *)0x0;
    (this_02->super_FxExpression).isresolved = false;
    (this_02->super_FxExpression).NeedResult = true;
    *(undefined8 *)&(this_02->super_FxExpression).ExprType = 0x11f00000016;
    this_02->Right = pFVar15;
    *(undefined8 **)&this_02->IsBitWrite = puVar16;
    ppuVar18 = &PTR__FxBinary_0070bea0;
    goto LAB_00533a71;
  case 0x281:
    this_02 = (FxAssign *)FMemArena::Alloc(&FxAlloc,0x48);
    pFVar15 = this->Self;
    puVar16 = (undefined8 *)FMemArena::Alloc(&FxAlloc,0x38);
    *puVar16 = &PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition((FScriptPosition *)(puVar16 + 1),pFVar23);
    *(undefined1 *)((long)puVar16 + 0x21) = 1;
    *(undefined4 *)((long)puVar16 + 0x24) = 4;
    *puVar16 = &PTR__FxConstant_0070d3e8;
    pPVar6 = TypeSInt32;
    puVar16[5] = TypeSInt32;
    puVar16[3] = pPVar6;
    *(undefined4 *)(puVar16 + 6) = 0;
    *(undefined1 *)(puVar16 + 4) = 1;
    (this_02->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition
              (&(this_02->super_FxExpression).ScriptPosition,&pFVar15->ScriptPosition);
    (this_02->super_FxExpression).ValueType = (PType *)0x0;
    (this_02->super_FxExpression).isresolved = false;
    (this_02->super_FxExpression).NeedResult = true;
    uVar17 = 0x11e00000016;
    break;
  case 0x282:
    local_50 = (FScriptPosition *)CONCAT44(local_50._4_4_,0xffffffff);
    goto LAB_00533924;
  case 0x283:
    local_50 = (FScriptPosition *)((ulong)local_50._4_4_ << 0x20);
LAB_00533924:
    this_02 = (FxAssign *)FMemArena::Alloc(&FxAlloc,0x48);
    pFVar15 = this->Self;
    right = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
    right->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition(&right->ScriptPosition,pFVar23);
    right->NeedResult = true;
    right->ExprType = EFX_Constant;
    right->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
    pPVar6 = TypeSInt32;
    right[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
    right->ValueType = (PType *)pPVar6;
    *(undefined4 *)&right[1].ScriptPosition.FileName.Chars = (undefined4)local_50;
    right->isresolved = true;
    FxAssign::FxAssign(this_02,pFVar15,right,false);
    ppuVar18 = (this_02->super_FxExpression)._vptr_FxExpression;
    goto LAB_00533a74;
  }
  *(undefined8 *)&(this_02->super_FxExpression).ExprType = uVar17;
  this_02->Right = pFVar15;
  *(undefined8 **)&this_02->IsBitWrite = puVar16;
  ppuVar18 = &PTR__FxBinary_0070be38;
LAB_00533a71:
  (this_02->super_FxExpression)._vptr_FxExpression = (_func_int **)ppuVar18;
LAB_00533a74:
  this->Self = (FxExpression *)0x0;
  iVar8 = (*((_func_int **)ppuVar18)[2])(this_02,ctx);
  pFVar15 = (FxExpression *)CONCAT44(extraout_var_06,iVar8);
  if (pFVar15 == (FxExpression *)0x0) {
LAB_0053314b:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pFVar15 = (FxExpression *)0x0;
  }
  else {
    if (((this->MethodName).Index & 0xfffffffeU) == 0x282) {
      pFVar15->ValueType = &TypeVoid->super_PType;
    }
LAB_005335f0:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  }
  return pFVar15;
}

Assistant:

FxExpression *FxMemberFunctionCall::Resolve(FCompileContext& ctx)
{
	ABORT(ctx.Class);
	PStruct *cls;
	bool staticonly = false;
	bool novirtual = false;

	PStruct *ccls = nullptr;

	for (auto a : ArgList)
	{
		if (a == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Empty function argument.");
			delete this;
			return nullptr;
		}
	}

	if (Self->ExprType == EFX_Identifier)
	{
		// If the left side is a class name for a static member function call it needs to be resolved manually 
		// because the resulting value type would cause problems in nearly every other place where identifiers are being used.
		ccls = FindStructType(static_cast<FxIdentifier *>(Self)->Identifier);
		if (ccls != nullptr) static_cast<FxIdentifier *>(Self)->noglobal = true;
	}

	SAFE_RESOLVE(Self, ctx);

	if (Self->ValueType == TypeError)
	{
		if (ccls != nullptr)
		{
			if (!ccls->IsKindOf(RUNTIME_CLASS(PClass)) || static_cast<PClass *>(ccls)->bExported)
			{
				cls = ccls;
				staticonly = true;
				goto isresolved;
			}
		}
	}

	if (Self->ExprType == EFX_Super)
	{
		auto clstype = dyn_cast<PClass>(ctx.Function->Variants[0].SelfClass);
		if (clstype != nullptr)
		{
			// give the node the proper value type now that we know it's properly used.
			cls = clstype->ParentClass;
			Self->ValueType = NewPointer(cls);
			Self->ExprType = EFX_Self;
			novirtual = true;	// super calls are always non-virtual
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Super requires a class type");
		}
	}

	// Note: These builtins would better be relegated to the actual type objects, instead of polluting this file, but that's a task for later.

	// Texture builtins.
	if (Self->ValueType == TypeTextureID)
	{
		if (MethodName == NAME_IsValid || MethodName == NAME_IsNull || MethodName == NAME_Exists || MethodName == NAME_SetInvalid || MethodName == NAME_SetNull)
		{
			if (ArgList.Size() > 0)
			{
				ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
				delete this;
				return nullptr;
			}
			// No need to create a dedicated node here, all builtins map directly to trivial operations.
			Self->ValueType = TypeSInt32;	// all builtins treat the texture index as integer.
			FxExpression *x;
			switch (MethodName)
			{
			case NAME_IsValid:
				x = new FxCompareRel('>', Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_IsNull:
				x = new FxCompareEq(TK_Eq, Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_Exists:
				x = new FxCompareRel(TK_Geq, Self, new FxConstant(0, ScriptPosition));
				break;

			case NAME_SetInvalid:
				x = new FxAssign(Self, new FxConstant(-1, ScriptPosition));
				break;

			case NAME_SetNull:
				x = new FxAssign(Self, new FxConstant(0, ScriptPosition));
				break;
			}
			Self = nullptr;
			SAFE_RESOLVE(x, ctx);
			if (MethodName == NAME_SetInvalid || MethodName == NAME_SetNull) x->ValueType = TypeVoid; // override the default type of the assignment operator.
			delete this;
			return x;
		}
	}

	if (Self->IsVector())
	{
		// handle builtins: Vectors got 2: Length and Unit.
		if (MethodName == NAME_Length || MethodName == NAME_Unit)
		{
			if (ArgList.Size() > 0)
			{
				ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
				delete this;
				return nullptr;
			}
			auto x = new FxVectorBuiltin(Self, MethodName);
			Self = nullptr;
			delete this;
			return x->Resolve(ctx);
		}
	}

	if (Self->ValueType == TypeString)
	{
		// same for String methods. It also uses a hidden struct type to define them.
		Self->ValueType = TypeStringStruct;
	}

	if (Self->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		auto ptype = static_cast<PPointer *>(Self->ValueType)->PointedType;
		if (ptype->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			if (ptype->IsKindOf(RUNTIME_CLASS(PClass)) && MethodName == NAME_GetClass)
			{
				if (ArgList.Size() > 0)
				{
					ScriptPosition.Message(MSG_ERROR, "too many parameters in call to %s", MethodName.GetChars());
					delete this;
					return nullptr;
				}
				auto x = new FxGetClass(Self);
				return x->Resolve(ctx);
			}
			cls = static_cast<PStruct *>(ptype);
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Left hand side of %s must point to a class object\n", MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}
	else if (Self->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		bool writable;
		if (Self->RequestAddress(ctx, &writable) && writable)
		{
			cls = static_cast<PStruct*>(Self->ValueType);
			Self->ValueType = NewPointer(Self->ValueType);
		}
		else
		{
			// Cannot be made writable so we cannot use its methods.
			ScriptPosition.Message(MSG_ERROR, "Invalid expression on left hand side of %s\n", MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Invalid expression on left hand side of %s\n", MethodName.GetChars());
		delete this;
		return nullptr;
	}

	// Todo: handle member calls from instantiated structs.

isresolved:
	bool error = false;
	PFunction *afd = FindClassMemberFunction(cls, ctx.Class, MethodName, ScriptPosition, &error);
	if (error)
	{
		delete this;
		return nullptr;
	}

	if (afd == nullptr)
	{
		ScriptPosition.Message(MSG_ERROR, "Unknown function %s\n", MethodName.GetChars());
		delete this;
		return nullptr;
	}

	if (staticonly && (afd->Variants[0].Flags & VARF_Method))
	{
		auto clstype = dyn_cast<PClass>(ctx.Class);
		auto ccls = dyn_cast<PClass>(cls);
		if (clstype == nullptr || ccls == nullptr || !clstype->IsDescendantOf(ccls))
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot call non-static function %s::%s from here\n", cls->TypeName.GetChars(), MethodName.GetChars());
			delete this;
			return nullptr;
		}
		else
		{
			// Todo: If this is a qualified call to a parent class function, let it through (but this needs to disable virtual calls later.)
			ScriptPosition.Message(MSG_ERROR, "Qualified member call to parent class %s::%s is not yet implemented\n", cls->TypeName.GetChars(), MethodName.GetChars());
			delete this;
			return nullptr;
		}
	}

	if (afd->Variants[0].Flags & VARF_Method)
	{
		if (Self->ExprType == EFX_Self)
		{
			if (!CheckFunctionCompatiblity(ScriptPosition, ctx.Function, afd))
			{
				delete this;
				return nullptr;
			}
		}
		else
		{
			// Functions with no Actor usage may not be called through a pointer because they will lose their context.
			if (!(afd->Variants[0].UseFlags & SUF_ACTOR))
			{
				ScriptPosition.Message(MSG_ERROR, "Function %s cannot be used with a non-self object\n", afd->SymbolName.GetChars());
				delete this;
				return nullptr;
			}
		}
	}

	// do not pass the self pointer to static functions.
	auto self = (afd->Variants[0].Flags & VARF_Method) ? Self : nullptr;
	auto x = new FxVMFunctionCall(self, afd, ArgList, ScriptPosition, staticonly|novirtual);
	if (Self == self) Self = nullptr;
	delete this;
	return x->Resolve(ctx);
}